

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void cmSourceFileSetName2(void *arg,char *name,char *dir,char *ext,int headerFileOnly)

{
  string fname;
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  if (*arg == 0) {
    if (headerFileOnly != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"HEADER_FILE_ONLY",&local_69);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"1",&local_6a);
      cmPropertyMap::SetProperty((cmPropertyMap *)((long)arg + 0x80),&local_68,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
    }
    std::__cxx11::string::assign((char *)((long)arg + 8));
    std::__cxx11::string::string((string *)&local_68,(string *)((long)arg + 8));
    if ((ext != (char *)0x0) && (*ext != '\0')) {
      std::__cxx11::string::append((char *)&local_68);
      std::__cxx11::string::append((char *)&local_68);
    }
    cmsys::SystemTools::CollapseFullPath(&local_48,&local_68,dir);
    std::__cxx11::string::operator=((string *)((long)arg + 0x48),(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    cmsys::SystemTools::ConvertToUnixSlashes((string *)((long)arg + 0x48));
    std::__cxx11::string::assign((char *)((long)arg + 0x28));
    std::__cxx11::string::~string((string *)&local_68);
  }
  return;
}

Assistant:

static void CCONV cmSourceFileSetName2(void* arg, const char* name,
                                       const char* dir, const char* ext,
                                       int headerFileOnly)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  if (sf->RealSourceFile) {
    // SetName is allowed only on temporary source files created by
    // the command for building and passing to AddSource.
    return;
  }

  // Implement the old SetName method code here.
  if (headerFileOnly) {
    sf->Properties.SetProperty("HEADER_FILE_ONLY", "1");
  }
  sf->SourceName = name;
  std::string fname = sf->SourceName;
  if (cmNonempty(ext)) {
    fname += ".";
    fname += ext;
  }
  sf->FullPath = cmSystemTools::CollapseFullPath(fname, dir);
  cmSystemTools::ConvertToUnixSlashes(sf->FullPath);
  sf->SourceExtension = ext;
}